

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsConflictPool.cpp
# Opt level: O1

void __thiscall HighsConflictPool::performAging(HighsConflictPool *this)

{
  int *piVar1;
  pointer psVar2;
  pointer piVar3;
  int iVar4;
  ulong uVar5;
  short sVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  
  uVar5 = (ulong)((long)(this->conflictRanges_).
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->conflictRanges_).
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 3;
  uVar8 = this->agelim_;
  iVar4 = (int)uVar5;
  if (5 < (int)uVar8) {
    iVar9 = iVar4 - (int)((ulong)((long)(this->deletedConflicts_).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                 (long)(this->deletedConflicts_).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start) >> 2);
    if (this->softlimit_ < iVar9) {
      uVar7 = uVar8;
      do {
        uVar8 = uVar7 - 1;
        if ((int)uVar7 < 7) break;
        iVar9 = iVar9 - (this->ageDistribution_).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar7];
        uVar7 = uVar8;
      } while (this->softlimit_ < iVar9);
    }
  }
  if (iVar4 != 0) {
    uVar10 = 0;
    do {
      psVar2 = (this->ages_).super__Vector_base<short,_std::allocator<short>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar6 = psVar2[uVar10];
      if (-1 < (long)sVar6) {
        piVar3 = (this->ageDistribution_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar1 = piVar3 + sVar6;
        *piVar1 = *piVar1 + -1;
        sVar6 = sVar6 + 1;
        psVar2[uVar10] = sVar6;
        if ((int)uVar8 < (int)sVar6) {
          psVar2[uVar10] = -1;
          removeConflict(this,(HighsInt)uVar10);
        }
        else {
          piVar1 = piVar3 + sVar6;
          *piVar1 = *piVar1 + 1;
        }
      }
      uVar10 = uVar10 + 1;
    } while ((uVar5 & 0xffffffff) != uVar10);
  }
  return;
}

Assistant:

void HighsConflictPool::performAging() {
  HighsInt conflictMaxIndex = conflictRanges_.size();
  HighsInt agelim = agelim_;
  HighsInt numActiveConflicts = getNumConflicts();
  while (agelim > 5 && numActiveConflicts > softlimit_) {
    numActiveConflicts -= ageDistribution_[agelim];
    --agelim;
  }

  for (HighsInt i = 0; i != conflictMaxIndex; ++i) {
    if (ages_[i] < 0) continue;

    ageDistribution_[ages_[i]] -= 1;
    ages_[i] += 1;

    if (ages_[i] > agelim) {
      ages_[i] = -1;
      removeConflict(i);
    } else
      ageDistribution_[ages_[i]] += 1;
  }
}